

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

string * __thiscall
BayesianGameForDecPOMDPStage::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameForDecPOMDPStage *this)

{
  int *piVar1;
  sp_counted_base *psVar2;
  element_type *peVar3;
  ostream *poVar4;
  stringstream ss;
  string local_1e8;
  element_type *local_1c8;
  shared_count asStack_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Bayesian Game for stage t=",0x1a);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," of a Dec-POMDP",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  psVar2 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
  peVar3 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px;
  local_1e8._M_string_length =
       (size_type)(this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_1e8._M_dataplus._M_p = (pointer)peVar3;
  boost::detail::shared_count::~shared_count((shared_count *)&local_1e8._M_string_length);
  if (peVar3 != (element_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"Past policy that lead to this BG=",0x21);
    psVar2 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
    local_1c8 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px;
    asStack_1c0[0].pi_ = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
    if (psVar2 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar2->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    (*(local_1c8->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
      _vptr_JointPolicy[6])(&local_1e8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count(asStack_1c0);
  }
  BayesianGameIdenticalPayoff::SoftPrint_abi_cxx11_
            (&local_1e8,&this->super_BayesianGameIdenticalPayoff);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameForDecPOMDPStage::SoftPrint() const
{
    stringstream ss;
    ss << "Bayesian Game for stage t="<<GetStage()<<" of a Dec-POMDP"<<endl;
    if(GetPastJointPolicy() != 0)
        ss<< "Past policy that lead to this BG=" << GetPastJointPolicy()->SoftPrint()<<endl;
    ss << BayesianGameIdenticalPayoff::SoftPrint();    
    return(ss.str());
}